

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.h
# Opt level: O0

bool __thiscall crnlib::sparse_bit_array::get_bit(sparse_bit_array *this,uint index)

{
  uint bit;
  uint bit_ofs;
  uint32 *pGroup;
  uint group_index;
  uint index_local;
  sparse_bit_array *this_local;
  bool local_1;
  
  if (this->m_ppGroups[index >> 9] == (uint32 *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = (this->m_ppGroups[index >> 9][(index & 0x1ff) >> 5] &
              1 << ((byte)(index & 0x1ff) & 0x1f)) != 0;
  }
  return local_1;
}

Assistant:

inline bool get_bit(uint index) const {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup)
      return 0;

    uint bit_ofs = index & (cBitsPerGroup - 1);

    uint bit = (1U << (bit_ofs & 31));

    return (pGroup[bit_ofs >> 5] & bit) != 0;
  }